

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareDistance<double>(Vector3<double> *x,Vector3<double> *y,double r2)

{
  double dVar1;
  int local_24;
  int sign;
  double r2_local;
  Vector3<double> *y_local;
  Vector3<double> *x_local;
  
  local_24 = TriageCompareCosDistance<double>(x,y,r2);
  if (local_24 == 0) {
    dVar1 = S1ChordAngle::length2((S1ChordAngle *)&k45Degrees);
    if (r2 < dVar1) {
      local_24 = TriageCompareSin2Distance<double>(x,y,r2);
    }
  }
  return local_24;
}

Assistant:

int TriageCompareDistance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  // The Sin2 method is much more accurate for small distances, but it is only
  // valid when the actual distance and the distance limit are both less than
  // 90 degrees.  So we always start with the Cos method.
  int sign = TriageCompareCosDistance(x, y, r2);
  if (sign == 0 && r2 < k45Degrees.length2()) {
    sign = TriageCompareSin2Distance(x, y, r2);
  }
  return sign;
}